

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

t_object * __thiscall
xemmai::t_engine::f_new_type_on_boot<xemmai::t_native>
          (t_engine *this,size_t a_fields,t_type *a_super,t_object *a_module)

{
  t_object *ptVar1;
  t_type_of<xemmai::t_object> *this_00;
  pair<xemmai::t_slot,_xemmai::t_value<xemmai::t_slot>_> *__first;
  long *in_FS_OFFSET;
  map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  local_c8;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  local_98;
  int local_7c;
  t_object *local_78;
  t_object *p;
  t_object *a_module_local;
  t_type *a_super_local;
  size_t a_fields_local;
  t_engine *this_local;
  t_object *local_48;
  t_object *local_40;
  t_object *local_38;
  t_object *local_30;
  t_queue<128UL> *local_28;
  t_object *local_20;
  t_queue<256UL> *local_18;
  undefined4 local_c;
  
  p = a_module;
  a_module_local = (t_object *)a_super;
  a_super_local = (t_type *)a_fields;
  a_fields_local = (size_t)this;
  local_78 = f_allocate_for_type<xemmai::t_type_of<xemmai::t_native>>(this,a_fields);
  this_00 = (t_type_of<xemmai::t_object> *)t_object::f_data(local_78);
  local_7c = 0;
  local_98.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::vector(&local_98);
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_c8._M_t._M_impl._0_8_ = 0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::map(&local_c8);
  t_type_of<xemmai::t_native>::
  t_finalizes<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*&,xemmai::t_object*&,unsigned_long_const&,int,std::vector<std::pair<xemmai::t_root,xemmai::t_value<std::vector>>,std::allocator<xemmai::t_value>>,std::map<xemmai::t_type_of<xemmai::t_object>*,unsigned_long,std::less<xemmai::t_type_of<xemmai::t_object>*>,std::allocator<unsigned_long_const&<xemmai::t_type_of<xemmai::t_object>*const,unsigned_long>>>>
            ((t_type_of<xemmai::t_native> *)this_00,
             &t_bears<xemmai::t_native,_xemmai::t_type_of<xemmai::t_object>_>::c_IDS,
             (t_type_of<xemmai::t_object> **)&a_module_local,&p,
             &t_derives<xemmai::t_native,_xemmai::t_type_of<xemmai::t_object>_>::c_NATIVE,&local_7c,
             &local_98,&local_c8);
  __first = t_type_of<xemmai::t_object>::f_fields(this_00);
  std::
  uninitialized_default_construct_n<std::pair<xemmai::t_slot,xemmai::t_value<xemmai::t_slot>>*,unsigned_long>
            (__first,(unsigned_long)a_super_local);
  std::
  map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~map(&local_c8);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_98);
  ptVar1 = local_78;
  this_local = (t_engine *)this->v_type_type;
  local_48 = local_78;
  local_40 = t_object::f_of(this_local);
  local_28 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
  *local_28->v_head = local_40;
  local_30 = local_40;
  if (local_28->v_head == local_28->v_next) {
    t_slot::t_queue<128UL>::f_next(local_28);
  }
  else {
    local_28->v_head = local_28->v_head + 1;
  }
  local_c = 3;
  ptVar1->v_type = (t_type *)this_local;
  local_38 = ptVar1;
  local_18 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
  local_20 = ptVar1;
  *local_18->v_head = ptVar1;
  if (local_18->v_head == local_18->v_next) {
    t_slot::t_queue<256UL>::f_next(local_18);
  }
  else {
    local_18->v_head = local_18->v_head + 1;
  }
  return local_78;
}

Assistant:

t_object* f_new_type_on_boot(size_t a_fields, t_type* a_super, t_object* a_module)
	{
		auto p = f_allocate_for_type<t_type_of<T>>(a_fields);
		std::uninitialized_default_construct_n((new(p->f_data()) t_type_of<T>(t_type_of<T>::c_IDS, a_super, a_module, t_type_of<T>::c_NATIVE, 0, std::vector<std::pair<t_root, t_rvalue>>{}, std::map<t_object*, size_t>{}))->f_fields(), a_fields);
		p->f_be(v_type_type);
		return p;
	}